

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cc
# Opt level: O2

string * __thiscall
muduo::CurrentThread::stackTrace_abi_cxx11_
          (string *__return_storage_ptr__,CurrentThread *this,bool demangle)

{
  char cVar1;
  int iVar2;
  void *__ptr;
  char *pcVar3;
  void *pvVar4;
  undefined7 in_register_00000011;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int status;
  void *local_690;
  long local_688;
  size_t len;
  void *frame [200];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = backtrace(frame,200,CONCAT71(in_register_00000011,demangle));
  __ptr = (void *)backtrace_symbols(frame,iVar2);
  if (__ptr != (void *)0x0) {
    len = 0x100;
    if ((char)this == '\0') {
      local_690 = (void *)0x0;
    }
    else {
      local_690 = malloc(0x100);
    }
    local_688 = (long)iVar2;
    for (lVar5 = 1; lVar5 < local_688; lVar5 = lVar5 + 1) {
      if ((char)this == '\0') {
LAB_0011c5ae:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        pcVar6 = (char *)0x0;
        pcVar8 = (char *)0x0;
        for (pcVar3 = *(char **)((long)__ptr + lVar5 * 8);
            ((cVar1 = *pcVar3, pcVar7 = pcVar6, pcVar9 = pcVar3, cVar1 == '(' ||
             (pcVar7 = pcVar3, pcVar9 = pcVar8, cVar1 == '+')) || (pcVar7 = pcVar6, cVar1 != '\0'));
            pcVar3 = pcVar3 + 1) {
          pcVar6 = pcVar7;
          pcVar8 = pcVar9;
        }
        if (pcVar8 == (char *)0x0 || pcVar6 == (char *)0x0) goto LAB_0011c5ae;
        *pcVar6 = '\0';
        status = 0;
        pvVar4 = (void *)__cxa_demangle(pcVar8 + 1,local_690,&len,&status);
        *pcVar6 = '+';
        if (status != 0) goto LAB_0011c5ae;
        std::__cxx11::string::append<char*,void>
                  ((string *)__return_storage_ptr__,*(char **)((long)__ptr + lVar5 * 8),pcVar8 + 1);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        local_690 = pvVar4;
      }
    }
    free(local_690);
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

string stackTrace(bool demangle)
{
  string stack;
  const int max_frames = 200;
  void* frame[max_frames];
  int nptrs = ::backtrace(frame, max_frames);
  char** strings = ::backtrace_symbols(frame, nptrs);
  if (strings)
  {
    size_t len = 256;
    char* demangled = demangle ? static_cast<char*>(::malloc(len)) : nullptr;
    for (int i = 1; i < nptrs; ++i)  // skipping the 0-th, which is this function
    {
      if (demangle)
      {
        // https://panthema.net/2008/0901-stacktrace-demangled/
        // bin/exception_test(_ZN3Bar4testEv+0x79) [0x401909]
        char* left_par = nullptr;
        char* plus = nullptr;
        for (char* p = strings[i]; *p; ++p)
        {
          if (*p == '(')
            left_par = p;
          else if (*p == '+')
            plus = p;
        }

        if (left_par && plus)
        {
          *plus = '\0';
          int status = 0;
          char* ret = abi::__cxa_demangle(left_par+1, demangled, &len, &status);
          *plus = '+';
          if (status == 0)
          {
            demangled = ret;  // ret could be realloc()
            stack.append(strings[i], left_par+1);
            stack.append(demangled);
            stack.append(plus);
            stack.push_back('\n');
            continue;
          }
        }
      }
      // Fallback to mangled names
      stack.append(strings[i]);
      stack.push_back('\n');
    }
    free(demangled);
    free(strings);
  }
  return stack;
}